

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

bool __thiscall
slang::ast::AssertionExpr::checkAssertionCall
          (AssertionExpr *this,CallExpression *call,ASTContext *context,DiagCode outArgCode,
          DiagCode refArgCode,DiagCode nonVoidCode,SourceRange range,bool isInsideSequence)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  SubroutineKind SVar4;
  uint uVar5;
  Diagnostic *pDVar6;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar7;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar8;
  pointer ppFVar9;
  Symbol *pSVar10;
  Diagnostic *this_00;
  SourceLocation noteLocation;
  long lVar11;
  string_view arg;
  ArgList AVar12;
  
  if ((nonVoidCode != (DiagCode)0x0) || ((char)this[6].kind == Simple)) {
    SVar4 = CallExpression::getSubroutineKind((CallExpression *)this);
    if ((SVar4 == Function) &&
       ((bVar3 = Type::isVoid((Type *)this->syntax), !bVar3 &&
        (bVar3 = Type::isError((Type *)this->syntax), !bVar3)))) {
      pDVar6 = ASTContext::addDiag((ASTContext *)call,refArgCode,range);
      arg = CallExpression::getSubroutineName((CallExpression *)this);
      Diagnostic::operator<<(pDVar6,arg);
    }
    if ((char)this[6].kind == Simple) {
      pvVar7 = std::
               get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           *)(this + 3));
      if (((pvVar7->subroutine).ptr)->hasOutputArgs == true) {
        ASTContext::addDiag((ASTContext *)call,SUB84(context,0),range);
        return false;
      }
      return true;
    }
  }
  ppSVar8 = std::
            get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                      ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        *)(this + 3));
  lVar2 = *(long *)(this + 7);
  AVar12 = SubroutineSymbol::getArguments(*ppSVar8);
  ppFVar9 = AVar12._M_ptr;
  lVar11 = 0;
  do {
    if (AVar12._M_extent._M_extent_value._M_extent_value << 3 == lVar11) {
      return true;
    }
    iVar1 = *(int *)(*(long *)((long)ppFVar9 + lVar11) + 0x158);
    if (iVar1 == 3) {
      pSVar10 = Expression::getSymbolReference(*(Expression **)(lVar2 + lVar11),true);
      if ((((pSVar10 != (Symbol *)0x0) && (uVar5 = pSVar10->kind - Variable, uVar5 < 0x19)) &&
          ((0x1800c0fU >> (uVar5 & 0x1f) & 1) != 0)) && (*(int *)&pSVar10[5].name._M_str == 0)) {
        pDVar6 = ASTContext::addDiag((ASTContext *)call,outArgCode,
                                     *(SourceRange *)(*(long *)(lVar2 + lVar11) + 0x20));
        this_00 = Diagnostic::operator<<(pDVar6,pSVar10->name);
        Diagnostic::operator<<(this_00,*(string_view *)(*(long *)((long)ppFVar9 + lVar11) + 8));
        noteLocation = pSVar10->location;
        goto LAB_00447a50;
      }
    }
    else if (iVar1 - 1U < 2) {
      pDVar6 = ASTContext::addDiag((ASTContext *)call,SUB84(context,0),range);
      noteLocation = *(SourceLocation *)(*(long *)((long)ppFVar9 + lVar11) + 0x18);
LAB_00447a50:
      Diagnostic::addNote(pDVar6,(DiagCode)0x50001,noteLocation);
      return false;
    }
    lVar11 = lVar11 + 8;
  } while( true );
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       DiagCode nonVoidCode, SourceRange range,
                                       bool isInsideSequence) {
    if (isInsideSequence || call.isSystemCall()) {
        if (call.getSubroutineKind() == SubroutineKind::Function && !call.type->isVoid() &&
            !call.type->isError()) {
            context.addDiag(nonVoidCode, range) << call.getSubroutineName();
        }
    }

    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                SLANG_ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}